

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O2

int Llb_ManCutVolume(Aig_Man_t *p,Vec_Ptr_t *vLower,Vec_Ptr_t *vUpper)

{
  int iVar1;
  void *pvVar2;
  Aig_Obj_t *pObj;
  int iVar3;
  int iVar4;
  
  Aig_ManIncrementTravId(p);
  for (iVar3 = 0; iVar3 < vLower->nSize; iVar3 = iVar3 + 1) {
    pvVar2 = Vec_PtrEntry(vLower,iVar3);
    *(int *)((long)pvVar2 + 0x20) = p->nTravIds;
  }
  iVar4 = 0;
  for (iVar3 = 0; iVar3 < vUpper->nSize; iVar3 = iVar3 + 1) {
    pObj = (Aig_Obj_t *)Vec_PtrEntry(vUpper,iVar3);
    iVar1 = Llb_ManCutVolume_rec(p,pObj);
    iVar4 = iVar4 + iVar1;
  }
  return iVar4;
}

Assistant:

int Llb_ManCutVolume( Aig_Man_t * p, Vec_Ptr_t * vLower, Vec_Ptr_t * vUpper )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    // mark the lower cut with the traversal ID
    Aig_ManIncrementTravId(p);
    Vec_PtrForEachEntry( Aig_Obj_t *, vLower, pObj, i )
        Aig_ObjSetTravIdCurrent( p, pObj );
    // count the upper cut
    Vec_PtrForEachEntry( Aig_Obj_t *, vUpper, pObj, i )
        Counter += Llb_ManCutVolume_rec( p, pObj );
    return Counter;
}